

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O0

ps_alignment_entry_t * ps_alignment_vector_grow_one(ps_alignment_vector_t *vec)

{
  ps_alignment_entry_t *ppVar1;
  void *ptr;
  ps_alignment_vector_t *vec_local;
  
  ppVar1 = (ps_alignment_entry_t *)vector_grow_one(vec->seq,&vec->n_alloc,&vec->n_ent,0x1c);
  if (ppVar1 == (ps_alignment_entry_t *)0x0) {
    vec_local = (ps_alignment_vector_t *)0x0;
  }
  else {
    vec->seq = ppVar1;
    vec_local = (ps_alignment_vector_t *)(vec->seq + (long)(int)(uint)vec->n_ent + -1);
  }
  return (ps_alignment_entry_t *)vec_local;
}

Assistant:

static ps_alignment_entry_t *
ps_alignment_vector_grow_one(ps_alignment_vector_t *vec)
{
    void *ptr;
    ptr = vector_grow_one(vec->seq, &vec->n_alloc,
                          &vec->n_ent, sizeof(*vec->seq));
    if (ptr == NULL)
        return NULL;
    vec->seq = ptr;
    return vec->seq + vec->n_ent - 1;
}